

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS ref_facelift_attach(REF_GRID ref_grid)

{
  double *pdVar1;
  int iVar2;
  REF_GEOM pRVar3;
  REF_DBL *pRVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  REF_ADJ pRVar9;
  int iVar10;
  undefined8 uVar11;
  REF_ADJ_ITEM pRVar12;
  ulong uVar13;
  REF_GRID pRVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  REF_CELL pRVar18;
  undefined1 auVar19 [16];
  REF_FACELIFT ref_facelift;
  REF_GRID freeable_ref_grid;
  REF_DBL node_xyz [3];
  REF_INT nodes [27];
  double local_158;
  int local_14c;
  long local_148;
  REF_CELL local_140;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  double dStack_120;
  REF_GRID local_110;
  long local_108;
  ulong local_100;
  REF_FACELIFT local_f8;
  REF_GRID local_f0;
  REF_DBL local_e8 [4];
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  uVar8 = ref_grid_deep_copy(&local_f0,ref_grid);
  if (uVar8 == 0) {
    uVar8 = ref_facelift_create(&local_f8,local_f0,0);
    if (uVar8 == 0) {
      ref_grid->geom->ref_facelift = local_f8;
      if (local_f8->displacement != (REF_DBL *)0x0) {
        pRVar3 = local_f8->grid->geom;
        local_110 = ref_grid;
        if (0 < pRVar3->max) {
          lVar16 = 0;
          do {
            if (pRVar3->descr[lVar16 * 6] == 0) {
              uVar8 = ref_egads_eval(pRVar3,(REF_INT)lVar16,local_c8,(REF_DBL *)0x0);
              if (uVar8 != 0) {
                pcVar15 = "eval node";
                uVar11 = 0x188;
                goto LAB_001ba984;
              }
              iVar10 = pRVar3->descr[lVar16 * 6 + 5];
              if (((-1 < (long)iVar10) && (pRVar9 = pRVar3->ref_adj, iVar10 < pRVar9->nnode)) &&
                 (iVar10 = pRVar9->first[iVar10], iVar10 != -1)) {
                pRVar12 = pRVar9->item;
                do {
                  iVar2 = pRVar12[iVar10].ref;
                  lVar17 = (long)iVar2;
                  if ((pRVar3->descr[lVar17 * 6] == 1) && (local_f8->strong_bc[lVar17] == 0)) {
                    uVar8 = ref_egads_eval(pRVar3,iVar2,local_e8,(REF_DBL *)0x0);
                    if (uVar8 != 0) {
                      pcVar15 = "eval face";
                      uVar11 = 0x18d;
                      goto LAB_001ba984;
                    }
                    local_f8->strong_bc[lVar17] = 1;
                    pRVar4 = local_f8->displacement;
                    lVar17 = 0;
                    do {
                      pRVar4[iVar2 * 3 + lVar17] = local_c8[lVar17] - local_e8[lVar17];
                      lVar17 = lVar17 + 1;
                    } while (lVar17 != 3);
                    pRVar9 = pRVar3->ref_adj;
                  }
                  pRVar12 = pRVar9->item;
                  iVar10 = pRVar12[iVar10].next;
                } while (iVar10 != -1);
              }
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < pRVar3->max);
        }
        uVar13 = 0;
LAB_001ba318:
        if (local_f8->displacement != (REF_DBL *)0x0) goto code_r0x001ba323;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x154,"ref_facelift_solve_edge","requires indirect facelift");
        uVar8 = 1;
LAB_001ba963:
        pcVar15 = "solve";
        uVar11 = 0x197;
LAB_001ba984:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               uVar11,"ref_facelift_initialize_edge",(ulong)uVar8,pcVar15);
        goto LAB_001ba98e;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x183,"ref_facelift_initialize_edge","requires indirect facelift");
      uVar8 = 1;
LAB_001ba98e:
      pcVar15 = "init disp";
      uVar11 = 0x1b9;
    }
    else {
      pcVar15 = "create";
      uVar11 = 0x1b7;
    }
  }
  else {
    pcVar15 = "deep copy";
    uVar11 = 0x1b5;
  }
  goto LAB_001ba9af;
code_r0x001ba323:
  pRVar3 = local_f8->grid->geom;
  iVar10 = pRVar3->max;
  if (0 < iVar10) {
    pRVar18 = local_f8->edg_cell;
    lVar16 = 0;
    do {
      if ((pRVar3->descr[lVar16 * 6] == 1) && (local_f8->strong_bc[lVar16] == 0)) {
        iVar2 = pRVar3->descr[lVar16 * 6 + 5];
        if ((-1 < (long)iVar2) &&
           ((pRVar9 = pRVar18->ref_adj, iVar2 < pRVar9->nnode &&
            (lVar17 = (long)pRVar9->first[iVar2], lVar17 != -1)))) {
          local_148 = lVar17;
          local_100 = uVar13;
          uVar8 = ref_cell_nodes(pRVar18,pRVar9->item[lVar17].ref,local_a8);
          if (uVar8 != 0) {
LAB_001baa1a:
            pcVar15 = "nodes";
            uVar11 = 0x15f;
LAB_001ba959:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,uVar11,"ref_facelift_solve_edge",(ulong)uVar8,pcVar15);
            goto LAB_001ba963;
          }
          local_108 = lVar16 * 0x18;
          local_128 = 0.0;
          dStack_120 = 0.0;
          local_158 = 0.0;
          local_138 = 0.0;
          uStack_130 = 0;
          local_140 = pRVar18;
          while( true ) {
            iVar10 = pRVar18->node_per;
            if (0 < iVar10) {
              lVar17 = 0;
              do {
                if (local_a8[lVar17] != iVar2) {
                  uVar8 = ref_geom_find(pRVar3,local_a8[lVar17],1,pRVar3->descr[lVar16 * 6 | 1],
                                        &local_14c);
                  if (uVar8 != 0) {
                    pcVar15 = "other geom";
                    uVar11 = 0x164;
                    goto LAB_001ba959;
                  }
                  local_138 = local_138 + 0.5;
                  pdVar1 = local_f8->displacement + (long)local_14c * 3;
                  local_128 = local_128 + *pdVar1 * 0.5;
                  dStack_120 = dStack_120 + pdVar1[1] * 0.5;
                  local_158 = local_158 + local_f8->displacement[(long)local_14c * 3 + 2] * 0.5;
                  iVar10 = local_140->node_per;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < iVar10);
            }
            pRVar18 = local_140;
            if (0.1 < local_138) {
              auVar6._8_8_ = dStack_120;
              auVar6._0_8_ = local_128;
              auVar19._8_8_ = local_138;
              auVar19._0_8_ = local_138;
              auVar19 = divpd(auVar6,auVar19);
              pRVar4 = local_f8->displacement;
              *(undefined1 (*) [16])((long)pRVar4 + local_108) = auVar19;
              *(double *)((long)pRVar4 + local_108 + 0x10) = local_158 / local_138;
            }
            pRVar12 = local_140->ref_adj->item;
            lVar17 = (long)pRVar12[(int)local_148].next;
            if (lVar17 == -1) break;
            local_148 = lVar17;
            uVar8 = ref_cell_nodes(local_140,pRVar12[lVar17].ref,local_a8);
            if (uVar8 != 0) goto LAB_001baa1a;
          }
          iVar10 = pRVar3->max;
          uVar13 = local_100;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar10);
  }
  uVar8 = (int)uVar13 + 1;
  uVar13 = (ulong)uVar8;
  if (uVar8 == 100) goto code_r0x001ba552;
  goto LAB_001ba318;
code_r0x001ba69c:
  pRVar3 = local_f8->grid->geom;
  iVar10 = pRVar3->max;
  if (0 < iVar10) {
    pRVar18 = local_f8->tri_cell;
    lVar16 = 0;
    do {
      if ((pRVar3->descr[lVar16 * 6] == 2) && (local_f8->strong_bc[lVar16] == 0)) {
        iVar2 = pRVar3->descr[lVar16 * 6 + 5];
        if ((-1 < (long)iVar2) &&
           ((pRVar9 = pRVar18->ref_adj, iVar2 < pRVar9->nnode &&
            (lVar17 = (long)pRVar9->first[iVar2], lVar17 != -1)))) {
          local_148 = lVar17;
          local_110 = pRVar14;
          uVar8 = ref_cell_nodes(pRVar18,pRVar9->item[lVar17].ref,local_a8);
          if (uVar8 != 0) {
LAB_001bab6b:
            pcVar15 = "nodes";
            uVar11 = 0x110;
LAB_001baac6:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,uVar11,"ref_facelift_solve_face",(ulong)uVar8,pcVar15);
            goto LAB_001baad0;
          }
          local_108 = lVar16 * 0x18;
          local_128 = 0.0;
          dStack_120 = 0.0;
          local_158 = 0.0;
          local_138 = 0.0;
          uStack_130 = 0;
          local_140 = pRVar18;
          while( true ) {
            iVar10 = pRVar18->node_per;
            if (0 < iVar10) {
              lVar17 = 0;
              do {
                if (local_a8[lVar17] != iVar2) {
                  uVar8 = ref_geom_find(pRVar3,local_a8[lVar17],2,pRVar3->descr[lVar16 * 6 | 1],
                                        &local_14c);
                  if (uVar8 != 0) {
                    pcVar15 = "other geom";
                    uVar11 = 0x115;
                    goto LAB_001baac6;
                  }
                  local_138 = local_138 + 0.5;
                  pdVar1 = local_f8->displacement + (long)local_14c * 3;
                  local_128 = local_128 + *pdVar1 * 0.5;
                  dStack_120 = dStack_120 + pdVar1[1] * 0.5;
                  local_158 = local_158 + local_f8->displacement[(long)local_14c * 3 + 2] * 0.5;
                  iVar10 = local_140->node_per;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < iVar10);
            }
            pRVar18 = local_140;
            if (0.1 < local_138) {
              auVar7._8_8_ = dStack_120;
              auVar7._0_8_ = local_128;
              auVar5._8_8_ = local_138;
              auVar5._0_8_ = local_138;
              auVar19 = divpd(auVar7,auVar5);
              pRVar4 = local_f8->displacement;
              *(undefined1 (*) [16])((long)pRVar4 + local_108) = auVar19;
              *(double *)((long)pRVar4 + local_108 + 0x10) = local_158 / local_138;
            }
            pRVar12 = local_140->ref_adj->item;
            lVar17 = (long)pRVar12[(int)local_148].next;
            if (lVar17 == -1) break;
            local_148 = lVar17;
            uVar8 = ref_cell_nodes(local_140,pRVar12[lVar17].ref,local_a8);
            if (uVar8 != 0) goto LAB_001bab6b;
          }
          iVar10 = pRVar3->max;
          pRVar14 = local_110;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar10);
  }
  uVar8 = (int)pRVar14 + 1;
  pRVar14 = (REF_GRID)(ulong)uVar8;
  if (uVar8 == 1000) goto code_r0x001ba8d2;
  goto LAB_001ba691;
code_r0x001ba8d2:
  uVar8 = ref_facelift_apply(local_f8);
  if (uVar8 == 0) {
    return 0;
  }
  pcVar15 = "apply";
  uVar11 = 0x1bc;
  goto LAB_001ba9af;
code_r0x001ba552:
  if (local_f8->displacement != (REF_DBL *)0x0) {
    pRVar3 = local_110->geom;
    if (0 < pRVar3->max) {
      lVar16 = 0;
      do {
        if (pRVar3->descr[lVar16 * 6] == 1) {
          uVar8 = ref_egads_eval(pRVar3,(REF_INT)lVar16,local_c8,(REF_DBL *)0x0);
          if (uVar8 != 0) {
            pcVar15 = "eval edge";
            uVar11 = 0x138;
            goto LAB_001baaf1;
          }
          iVar10 = pRVar3->descr[lVar16 * 6 + 5];
          if (((-1 < (long)iVar10) && (pRVar9 = pRVar3->ref_adj, iVar10 < pRVar9->nnode)) &&
             (iVar10 = pRVar9->first[iVar10], iVar10 != -1)) {
            pRVar12 = pRVar9->item;
            do {
              iVar2 = pRVar12[iVar10].ref;
              lVar17 = (long)iVar2;
              if ((pRVar3->descr[lVar17 * 6] == 2) && (local_f8->strong_bc[lVar17] == 0)) {
                uVar8 = ref_egads_eval(pRVar3,iVar2,local_e8,(REF_DBL *)0x0);
                if (uVar8 != 0) {
                  pcVar15 = "eval face";
                  uVar11 = 0x13d;
                  goto LAB_001baaf1;
                }
                local_f8->strong_bc[lVar17] = 1;
                pRVar4 = local_f8->displacement;
                lVar17 = 0;
                do {
                  pRVar4[iVar2 * 3 + lVar17] = local_c8[lVar17] - local_e8[lVar17];
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 3);
                pRVar9 = pRVar3->ref_adj;
              }
              pRVar12 = pRVar9->item;
              iVar10 = pRVar12[iVar10].next;
            } while (iVar10 != -1);
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < pRVar3->max);
    }
    pRVar14 = (REF_GRID)0x0;
LAB_001ba691:
    if (local_f8->displacement != (REF_DBL *)0x0) goto code_r0x001ba69c;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x105,"ref_facelift_solve_face","requires indirect facelift");
    uVar8 = 1;
LAB_001baad0:
    pcVar15 = "solve";
    uVar11 = 0x148;
LAB_001baaf1:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           uVar11,"ref_facelift_initialize_face",(ulong)uVar8,pcVar15);
    goto LAB_001baafb;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",0x133,
         "ref_facelift_initialize_face","requires indirect facelift");
  uVar8 = 1;
LAB_001baafb:
  pcVar15 = "init disp";
  uVar11 = 0x1bb;
LAB_001ba9af:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar11
         ,"ref_facelift_attach",(ulong)uVar8,pcVar15);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_attach(REF_GRID ref_grid) {
  REF_GRID freeable_ref_grid;
  REF_FACELIFT ref_facelift;
  RSS(ref_grid_deep_copy(&freeable_ref_grid, ref_grid), "deep copy");
  RSS(ref_facelift_create(&ref_facelift, freeable_ref_grid, REF_FALSE),
      "create");
  ref_geom_facelift(ref_grid_geom(ref_grid)) = ref_facelift;
  RSS(ref_facelift_initialize_edge(ref_facelift), "init disp");
  RSS(ref_facelift_initialize_face(ref_facelift, ref_grid_geom(ref_grid)),
      "init disp");
  RSS(ref_facelift_apply(ref_facelift), "apply");
  return REF_SUCCESS;
}